

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

size_t __thiscall
duckdb_moodycamel::
ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::
ExplicitProducer::
dequeue_bulk<__gnu_cxx::__normal_iterator<duckdb::BufferEvictionNode*,std::vector<duckdb::BufferEvictionNode,std::allocator<duckdb::BufferEvictionNode>>>>
          (ExplicitProducer *this,
          __normal_iterator<duckdb::BufferEvictionNode_*,_std::vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>_>
          *itemFirst,size_t max)

{
  ExplicitProducer *pEVar1;
  long *plVar2;
  Block *this_00;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong i;
  ulong uVar8;
  
  uVar3 = (*(long *)(this + 0x38) - *(long *)(this + 0x30)) + *(long *)(this + 0x20);
  if (0 < (long)uVar3) {
    if (uVar3 < max) {
      max = uVar3;
    }
    LOCK();
    pEVar1 = this + 0x30;
    lVar4 = *(long *)pEVar1;
    *(size_t *)pEVar1 = *(long *)pEVar1 + max;
    UNLOCK();
    uVar3 = (*(long *)(this + 0x38) - lVar4) + *(long *)(this + 0x20);
    if (0 < (long)uVar3) {
      uVar6 = uVar3;
      if (max < uVar3) {
        uVar6 = max;
      }
      if (uVar3 < max) {
        LOCK();
        *(size_t *)(this + 0x38) = *(long *)(this + 0x38) + (max - uVar6);
        UNLOCK();
      }
      LOCK();
      pEVar1 = this + 0x28;
      i = *(ulong *)pEVar1;
      *(ulong *)pEVar1 = *(ulong *)pEVar1 + uVar6;
      UNLOCK();
      plVar2 = *(long **)(this + 0x58);
      uVar5 = *plVar2 - 1U &
              (long)((i & 0xffffffffffffffe0) - *(long *)(plVar2[2] + plVar2[1] * 0x10)) / 0x20 +
              plVar2[1];
      uVar3 = uVar6 + i;
      do {
        uVar8 = (i & 0xffffffffffffffe0) + 0x20;
        if (0x8000000000000000 < uVar3 - uVar8) {
          uVar8 = uVar3;
        }
        this_00 = *(Block **)(plVar2[2] + 8 + uVar5 * 0x10);
        for (uVar7 = i; uVar8 != uVar7; uVar7 = uVar7 + 1) {
          lVar4 = (ulong)((uint)uVar7 & 0x1f) * 0x18;
          duckdb::BufferEvictionNode::operator=
                    (itemFirst->_M_current,(BufferEvictionNode *)(this_00 + lVar4));
          itemFirst->_M_current = itemFirst->_M_current + 1;
          std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(this_00 + lVar4 + 8));
        }
        Block::
        set_many_empty<(duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::InnerQueueContext)1>
                  (this_00,i,uVar8 - i);
        uVar5 = uVar5 + 1 & *plVar2 - 1U;
        i = uVar8;
      } while (uVar8 != uVar3);
      return uVar6;
    }
    LOCK();
    *(size_t *)(this + 0x38) = *(long *)(this + 0x38) + max;
    UNLOCK();
  }
  return 0;
}

Assistant:

size_t dequeue_bulk(It& itemFirst, size_t max)
		{
			auto tail = this->tailIndex.load(std::memory_order_relaxed);
			auto overcommit = this->dequeueOvercommit.load(std::memory_order_relaxed);
			auto desiredCount = static_cast<size_t>(tail - (this->dequeueOptimisticCount.load(std::memory_order_relaxed) - overcommit));
			if (details::circular_less_than<size_t>(0, desiredCount)) {
				desiredCount = desiredCount < max ? desiredCount : max;
				std::atomic_thread_fence(std::memory_order_acquire);
				
				auto myDequeueCount = this->dequeueOptimisticCount.fetch_add(desiredCount, std::memory_order_relaxed);;
				
				tail = this->tailIndex.load(std::memory_order_acquire);
				auto actualCount = static_cast<size_t>(tail - (myDequeueCount - overcommit));
				if (details::circular_less_than<size_t>(0, actualCount)) {
					actualCount = desiredCount < actualCount ? desiredCount : actualCount;
					if (actualCount < desiredCount) {
						this->dequeueOvercommit.fetch_add(desiredCount - actualCount, std::memory_order_release);
					}
					
					// Get the first index. Note that since there's guaranteed to be at least actualCount elements, this
					// will never exceed tail.
					auto firstIndex = this->headIndex.fetch_add(actualCount, std::memory_order_acq_rel);
					
					// Determine which block the first element is in
					auto localBlockIndex = blockIndex.load(std::memory_order_acquire);
					auto localBlockIndexHead = localBlockIndex->front.load(std::memory_order_acquire);
					
					auto headBase = localBlockIndex->entries[localBlockIndexHead].base;
					auto firstBlockBaseIndex = firstIndex & ~static_cast<index_t>(BLOCK_SIZE - 1);
					auto offset = static_cast<size_t>(static_cast<typename std::make_signed<index_t>::type>(firstBlockBaseIndex - headBase) / static_cast<typename std::make_signed<index_t>::type>(BLOCK_SIZE));
					auto indexIndex = (localBlockIndexHead + offset) & (localBlockIndex->size - 1);
					
					// Iterate the blocks and dequeue
					auto index = firstIndex;
					do {
						auto firstIndexInBlock = index;
						auto endIndex = (index & ~static_cast<index_t>(BLOCK_SIZE - 1)) + static_cast<index_t>(BLOCK_SIZE);
						endIndex = details::circular_less_than<index_t>(firstIndex + static_cast<index_t>(actualCount), endIndex) ? firstIndex + static_cast<index_t>(actualCount) : endIndex;
						auto block = localBlockIndex->entries[indexIndex].block;
						if (MOODYCAMEL_NOEXCEPT_ASSIGN(T, T&&, details::deref_noexcept(itemFirst) = std::move((*(*block)[index])))) {
							while (index != endIndex) {
								auto& el = *((*block)[index]);
								*itemFirst++ = std::move(el);
								el.~T();
								++index;
							}
						}
						else {
							MOODYCAMEL_TRY {
								while (index != endIndex) {
									auto& el = *((*block)[index]);
									*itemFirst = std::move(el);
									++itemFirst;
									el.~T();
									++index;
								}
							}
							MOODYCAMEL_CATCH (...) {
								// It's too late to revert the dequeue, but we can make sure that all
								// the dequeued objects are properly destroyed and the block index
								// (and empty count) are properly updated before we propagate the exception
								do {
									block = localBlockIndex->entries[indexIndex].block;
									while (index != endIndex) {
										(*block)[index++]->~T();
									}
									block->ConcurrentQueue::Block::template set_many_empty<explicit_context>(firstIndexInBlock, static_cast<size_t>(endIndex - firstIndexInBlock));
									indexIndex = (indexIndex + 1) & (localBlockIndex->size - 1);
									
									firstIndexInBlock = index;
									endIndex = (index & ~static_cast<index_t>(BLOCK_SIZE - 1)) + static_cast<index_t>(BLOCK_SIZE);
									endIndex = details::circular_less_than<index_t>(firstIndex + static_cast<index_t>(actualCount), endIndex) ? firstIndex + static_cast<index_t>(actualCount) : endIndex;
								} while (index != firstIndex + actualCount);
								
								MOODYCAMEL_RETHROW;
							}
						}
						block->ConcurrentQueue::Block::template set_many_empty<explicit_context>(firstIndexInBlock, static_cast<size_t>(endIndex - firstIndexInBlock));
						indexIndex = (indexIndex + 1) & (localBlockIndex->size - 1);
					} while (index != firstIndex + actualCount);
					
					return actualCount;
				}
				else {
					// Wasn't anything to dequeue after all; make the effective dequeue count eventually consistent
					this->dequeueOvercommit.fetch_add(desiredCount, std::memory_order_release);
				}
			}
			
			return 0;
		}